

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentMemory.cpp
# Opt level: O2

void __thiscall wasm::InstrumentMemory::visitArrayGet(InstrumentMemory *this,ArrayGet *curr)

{
  Index IVar1;
  uintptr_t uVar2;
  size_t sVar3;
  char *pcVar4;
  Call *pCVar5;
  initializer_list<wasm::Expression_*> __l;
  Name target;
  initializer_list<wasm::Expression_*> __l_00;
  Name target_00;
  Const *local_60;
  ArrayGet *local_58;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_50;
  Builder local_38;
  Builder builder;
  
  pcVar4 = DAT_00e63900;
  sVar3 = array_get_index;
  local_38.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>_>
       ).super_PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>.
       super_Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>.currModule
  ;
  IVar1 = this->id;
  this->id = IVar1 + 1;
  local_60 = Builder::makeConst<int>(&local_38,IVar1);
  local_58 = (ArrayGet *)curr->index;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_60;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&local_50,__l,
             (allocator_type *)((long)&builder.wasm + 7));
  target.super_IString.str._M_str = pcVar4;
  target.super_IString.str._M_len = sVar3;
  pCVar5 = Builder::makeCall(&local_38,target,
                             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             &local_50,(Type)0x2,false);
  curr->index = (Expression *)pCVar5;
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            (&local_50);
  uVar2 = (curr->super_SpecificExpression<(wasm::Expression::Id)66>).super_Expression.type.id;
  if (uVar2 - 2 < 4) {
    sVar3 = *(size_t *)(&PTR_DAT_00e1f0d0)[uVar2];
    pcVar4 = *(char **)(&PTR_struct_set_val_f32_00e1f0b0)[uVar2];
    IVar1 = this->id;
    this->id = IVar1 + 1;
    local_60 = Builder::makeConst<int>(&local_38,IVar1);
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)&local_60;
    local_58 = curr;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&local_50,__l_00,
               (allocator_type *)((long)&builder.wasm + 7));
    target_00.super_IString.str._M_str = pcVar4;
    target_00.super_IString.str._M_len = sVar3;
    pCVar5 = Builder::makeCall(&local_38,target_00,
                               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               &local_50,
                               (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)66>).
                                     super_Expression.type.id,false);
    Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>_>
                ).
                super_PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>
                .super_Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>,
               (Expression *)pCVar5);
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              (&local_50);
  }
  return;
}

Assistant:

void visitArrayGet(ArrayGet* curr) {
    Builder builder(*getModule());
    curr->index =
      builder.makeCall(array_get_index,
                       {builder.makeConst(int32_t(id++)), curr->index},
                       Type::i32);
    Name target;
    if (curr->type == Type::i32) {
      target = array_get_val_i32;
    } else if (curr->type == Type::i64) {
      target = array_get_val_i64;
    } else if (curr->type == Type::f32) {
      target = array_get_val_f32;
    } else if (curr->type == Type::f64) {
      target = array_get_val_f64;
    } else {
      return; // TODO: other types, unreachable, etc.
    }
    replaceCurrent(builder.makeCall(
      target, {builder.makeConst(int32_t(id++)), curr}, curr->type));
  }